

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeHistogram.cpp
# Opt level: O1

void __thiscall OpenMD::ChargeHistogram::process(ChargeHistogram *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  AtomType *pAVar1;
  iterator iVar2;
  pointer pdVar3;
  pointer pdVar4;
  ChargeHistogram *pCVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  StuntDouble *pSVar9;
  ulong uVar10;
  double *pdVar11;
  long lVar12;
  RealType RVar13;
  undefined1 auVar14 [16];
  double dVar15;
  RealType min;
  FixedChargeAdapter fca;
  vector<double,_std::allocator<double>_> charge;
  FluctuatingChargeAdapter fqa;
  int ii;
  DumpReader reader;
  double local_12d8;
  FixedChargeAdapter local_12d0;
  double *local_12c8;
  iterator iStack_12c0;
  double *local_12b8;
  ChargeHistogram *local_12b0;
  double local_12a8;
  int local_129c;
  FluctuatingChargeAdapter local_1298;
  int local_128c;
  DumpReader local_1288;
  
  if ((this->evaluator_).isDynamic_ == true) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_1288,&this->evaluator_);
    lVar12 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar12),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(local_1288.info_)->_vptr_SimInfo + lVar12));
      lVar12 = lVar12 + 0x28;
    } while (lVar12 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_1288);
  }
  DumpReader::DumpReader
            (&local_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  iVar7 = DumpReader::getNFrames(&local_1288);
  iVar8 = iVar7 / (this->super_StaticAnalyser).step_;
  this->nProcessed_ = iVar8;
  local_12c8 = (double *)0x0;
  iStack_12c0._M_current = (double *)0x0;
  local_12b8 = (double *)0x0;
  this->nProcessed_ = iVar8;
  local_12b0 = this;
  if (0 < iVar7) {
    iVar8 = 0;
    local_129c = iVar7;
    do {
      local_12a8 = (double)CONCAT44(local_12a8._4_4_,iVar8);
      DumpReader::readFrame(&local_1288,iVar8);
      local_12b0->currentSnapshot_ =
           ((local_12b0->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      pSVar9 = SelectionManager::beginSelected(&this->seleMan_,&local_128c);
      while (pSVar9 != (StuntDouble *)0x0) {
        local_12d8 = 0.0;
        pAVar1 = (AtomType *)pSVar9[1]._vptr_StuntDouble;
        local_12d0.at_ = pAVar1;
        bVar6 = FixedChargeAdapter::isFixedCharge(&local_12d0);
        if (bVar6) {
          RVar13 = FixedChargeAdapter::getCharge(&local_12d0);
          local_12d8 = RVar13 + local_12d8;
        }
        local_1298.at_ = pAVar1;
        bVar6 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_1298);
        if (bVar6) {
          local_12d8 = *(double *)
                        (*(long *)((long)&(pSVar9->snapshotMan_->currentSnapshot_->atomData).
                                          flucQPos.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start +
                                  pSVar9->storage_) + (long)pSVar9->localIndex_ * 8) + local_12d8;
        }
        if (iStack_12c0._M_current == local_12b8) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_12c8,iStack_12c0,&local_12d8);
        }
        else {
          *iStack_12c0._M_current = local_12d8;
          iStack_12c0._M_current = iStack_12c0._M_current + 1;
        }
        pSVar9 = SelectionManager::nextSelected(&this->seleMan_,&local_128c);
      }
      iVar8 = local_12a8._0_4_ + (local_12b0->super_StaticAnalyser).step_;
    } while (iVar8 < local_129c);
  }
  if (local_12c8 == iStack_12c0._M_current) {
    builtin_strncpy(painCave.errMsg + 0x10,"t found.\n",10);
    builtin_strncpy(painCave.errMsg,"Selected atom no",0x10);
    painCave.isFatal = 1;
    simError();
  }
  pdVar11 = local_12c8;
  if (local_12c8 != iStack_12c0._M_current) {
    uVar10 = (long)iStack_12c0._M_current - (long)local_12c8 >> 3;
    lVar12 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_12c8,iStack_12c0._M_current,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar11);
  }
  pCVar5 = local_12b0;
  local_12d8 = *local_12c8;
  dVar15 = (iStack_12c0._M_current[-1] - local_12d8) / (double)local_12b0->nBins_;
  if ((dVar15 != 0.0) || (NAN(dVar15))) {
    local_12a8 = dVar15;
    if (-3 < local_12b0->nBins_) {
      this_00 = &local_12b0->bincenter_;
      this_01 = &local_12b0->histList_;
      iVar7 = -1;
      do {
        local_12d0.at_ = (AtomType *)((double)iVar7 * local_12a8 + local_12d8);
        iVar2._M_current =
             (pCVar5->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (pCVar5->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (this_00,iVar2,(double *)&local_12d0);
        }
        else {
          *iVar2._M_current = (double)local_12d0.at_;
          (pCVar5->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        local_12d0.at_ = (AtomType *)0x0;
        iVar2._M_current =
             (pCVar5->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (pCVar5->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (this_01,iVar2,(double *)&local_12d0);
        }
        else {
          *iVar2._M_current = 0.0;
          (pCVar5->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < pCVar5->nBins_ + 2);
    }
    if (local_12c8 < iStack_12c0._M_current) {
      lVar12 = (long)iStack_12c0._M_current - (long)local_12c8 >> 3;
      auVar14._8_4_ = (int)((long)iStack_12c0._M_current - (long)local_12c8 >> 0x23);
      auVar14._0_8_ = lVar12;
      auVar14._12_4_ = 0x45300000;
      pdVar3 = (pCVar5->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar7 = 0;
      pdVar11 = local_12c8;
      do {
        pdVar4 = (pCVar5->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          if ((*pdVar11 < pdVar3[iVar7]) || (pdVar3[(long)iVar7 + 1] <= *pdVar11)) {
            iVar7 = iVar7 + 1;
            bVar6 = true;
          }
          else {
            pdVar4[iVar7] =
                 pdVar4[iVar7] +
                 1.0 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0));
            bVar6 = false;
          }
        } while (bVar6);
        pdVar11 = pdVar11 + 1;
      } while (pdVar11 < iStack_12c0._M_current);
    }
  }
  else {
    iVar2._M_current =
         (local_12b0->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (local_12b0->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_12b0->bincenter_,iVar2,&local_12d8)
      ;
    }
    else {
      *iVar2._M_current = local_12d8;
      (local_12b0->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_12d0.at_ = (AtomType *)0x3ff0000000000000;
    iVar2._M_current =
         (pCVar5->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (pCVar5->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&pCVar5->histList_,iVar2,(double *)&local_12d0);
    }
    else {
      *iVar2._M_current = 1.0;
      (pCVar5->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  (*(pCVar5->super_StaticAnalyser)._vptr_StaticAnalyser[4])(pCVar5);
  if (local_12c8 != (double *)0x0) {
    operator_delete(local_12c8,(long)local_12b8 - (long)local_12c8);
  }
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void ChargeHistogram::process() {
    StuntDouble* sd;
    int ii;

    if (evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;
    vector<RealType> charge;

    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        RealType q = 0.0;
        Atom* atom = static_cast<Atom*>(sd);

        AtomType* atomType = atom->getAtomType();

        FixedChargeAdapter fca = FixedChargeAdapter(atomType);
        if (fca.isFixedCharge()) { q += fca.getCharge(); }

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
        if (fqa.isFluctuatingCharge()) { q += atom->getFlucQPos(); }

        charge.push_back(q);
      }
    }

    if (charge.empty()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Selected atom not found.\n");
      painCave.isFatal = 1;
      simError();
    }

    std::sort(charge.begin(), charge.end());

    RealType min = charge.front();
    RealType max = charge.back();

    RealType delta_charge = (max - min) / (nBins_);

    if (delta_charge == 0) {
      bincenter_.push_back(min);
      histList_.push_back(1);
    } else {
      // fill the center for histogram
      for (int j = 0; j < nBins_ + 3; ++j) {
        bincenter_.push_back(min + (j - 1) * delta_charge);
        histList_.push_back(0);
      }
      // filling up the histogram whith the densities
      int bin_center_pos = 0;
      vector<RealType>::iterator index;
      RealType charge_length = static_cast<RealType>(charge.size());

      bool hist_update;
      for (index = charge.begin(); index < charge.end(); index++) {
        hist_update = true;
        while (hist_update) {
          if (*index >= bincenter_[bin_center_pos] &&
              *index < bincenter_[bin_center_pos + 1]) {
            histList_[bin_center_pos] += 1.0 / charge_length;
            hist_update = false;
          } else {
            bin_center_pos++;
            hist_update = true;
          }
        }
      }
    }
    writeCharge();
  }